

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * push_data(string *e)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)this,(string *)e);
  local_18 = this;
  std::vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>>::
  emplace_back<std::__cxx11::string*>
            ((vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>> *)
             &v_str_abi_cxx11_,&local_18);
  return v_str_abi_cxx11_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

std::string* push_data(const std::string& e)
{
	v_str.push_back(new std::string(e));
	return v_str[v_str.size() - 1];
}